

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkTransRel(Abc_Ntk_t *pNtk,int fInputs,int fVerbose)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *vPairs;
  void **ppvVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  Abc_Ntk_t *pNtkNew;
  char Buffer [1000];
  Abc_Ntk_t *local_430;
  uint local_428;
  int local_424;
  Abc_Ntk_t *local_420;
  char local_418 [1000];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0xa8,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  iVar17 = pNtk->nObjCounts[8];
  lVar16 = (long)iVar17;
  local_424 = fInputs;
  if (lVar16 == 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0xa9,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  pAVar5 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  local_430 = pAVar5;
  sprintf(local_418,"%s_TR",pNtk->pName);
  pcVar6 = Extra_UtilStrsav(pNtk->pName);
  pAVar5->pName = pcVar6;
  Abc_NtkCleanCopy(pNtk);
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      plVar1 = (long *)pVVar8->pArray[lVar12];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        pAVar9 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
        pAVar7 = Abc_NtkCreateObj(pAVar5,ABC_OBJ_PI);
        (pAVar9->field_6).pCopy = pAVar7;
        pcVar6 = Abc_ObjName(pAVar9);
        Abc_ObjAssignName(pAVar7,pcVar6,(char *)0x0);
        pVVar8 = pNtk->vBoxes;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar8->nSize);
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        plVar1 = (long *)pVVar8->pArray[lVar12];
        if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
          pAVar9 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
          pAVar7 = Abc_NtkCreateObj(pAVar5,ABC_OBJ_PI);
          pcVar6 = Abc_ObjName(pAVar9);
          Abc_ObjAssignName(pAVar7,pcVar6,(char *)0x0);
          pVVar8 = pNtk->vBoxes;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar8->nSize);
    }
  }
  pVVar8 = pNtk->vPis;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      Abc_NtkDupObj(pAVar5,(Abc_Obj_t *)pVVar8->pArray[lVar12],1);
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar12 < pVVar8->nSize);
  }
  Abc_NtkCreateObj(pAVar5,ABC_OBJ_PO);
  pAVar9 = Abc_AigConst1(pAVar5);
  pAVar7 = Abc_AigConst1(pNtk);
  (pAVar7->field_6).pCopy = pAVar9;
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      plVar1 = (long *)pVVar8->pArray[lVar12];
      if ((plVar1 != (long *)0x0) && (uVar15 = *(uint *)((long)plVar1 + 0x14), (uVar15 & 0xf) == 7))
      {
        lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
        pAVar9 = Abc_AigAnd((Abc_Aig_t *)pAVar5->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(uVar15 >> 10 & 1) ^
                            *(ulong *)(*(long *)(lVar2 + (long)*(int *)plVar1[4] * 8) + 0x40)),
                            (Abc_Obj_t *)
                            ((ulong)(uVar15 >> 0xb & 1) ^
                            *(ulong *)(*(long *)(lVar2 + (long)((int *)plVar1[4])[1] * 8) + 0x40)));
        plVar1[8] = (long)pAVar9;
        pVVar8 = pNtk->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vBoxes;
  iVar13 = pVVar8->nSize;
  local_420 = pNtk;
  if (iVar13 != pNtk->nObjCounts[8]) {
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0xc5,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  uVar15 = iVar17 * 2;
  vPairs = (Vec_Ptr_t *)malloc(0x10);
  uVar14 = 8;
  if (8 < uVar15) {
    uVar14 = (ulong)uVar15;
  }
  vPairs->nSize = 0;
  vPairs->nCap = (int)uVar14;
  local_428 = uVar15;
  ppvVar10 = (void **)malloc((long)(int)uVar14 << 3);
  vPairs->pArray = ppvVar10;
  if (0 < iVar13) {
    iVar17 = 0;
    lVar12 = 0;
    do {
      plVar1 = (long *)pVVar8->pArray[lVar12];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
        uVar15 = *(uint *)((long)plVar1 + 0x14);
        uVar3 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)plVar1[4] * 8) + 0x40);
        iVar13 = (int)uVar14;
        if (iVar17 == iVar13) {
          if (iVar13 < 0x10) {
            if (vPairs->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vPairs->pArray,0x80);
            }
            vPairs->pArray = ppvVar10;
            vPairs->nCap = 0x10;
            uVar14 = 0x10;
          }
          else {
            uVar14 = (ulong)(uint)(iVar13 * 2);
            if (vPairs->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(uVar14 * 8);
            }
            else {
              ppvVar10 = (void **)realloc(vPairs->pArray,uVar14 * 8);
            }
            vPairs->pArray = ppvVar10;
            vPairs->nCap = iVar13 * 2;
          }
        }
        else {
          ppvVar10 = vPairs->pArray;
        }
        ppvVar10[iVar17] = (void *)(uVar15 >> 10 & 1 ^ uVar3);
        if ((lVar16 < 0) || (local_430->vPis->nSize <= lVar16)) goto LAB_002f6b17;
        iVar13 = iVar17 + 1;
        pvVar4 = local_430->vPis->pArray[lVar16];
        if (iVar13 == (int)uVar14) {
          if (iVar17 < 0xf) {
            if (vPairs->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vPairs->pArray,0x80);
            }
            vPairs->pArray = ppvVar10;
            vPairs->nCap = 0x10;
            uVar14 = 0x10;
          }
          else {
            uVar15 = (int)uVar14 * 2;
            uVar14 = (ulong)uVar15;
            if (vPairs->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(uVar14 * 8);
            }
            else {
              ppvVar10 = (void **)realloc(vPairs->pArray,uVar14 * 8);
            }
            vPairs->pArray = ppvVar10;
            vPairs->nCap = uVar15;
          }
        }
        else {
          ppvVar10 = vPairs->pArray;
        }
        iVar17 = iVar17 + 2;
        vPairs->nSize = iVar17;
        ppvVar10[iVar13] = pvVar4;
        pVVar8 = local_420->vBoxes;
      }
      lVar12 = lVar12 + 1;
      lVar16 = lVar16 + 1;
      pAVar5 = local_430;
    } while (lVar12 < pVVar8->nSize);
  }
  pAVar9 = Abc_AigMiter((Abc_Aig_t *)pAVar5->pManFunc,vPairs,0);
  if (vPairs->pArray != (void **)0x0) {
    free(vPairs->pArray);
  }
  free(vPairs);
  if (0 < pAVar5->vPos->nSize) {
    Abc_ObjAddFanin((Abc_Obj_t *)*pAVar5->vPos->pArray,(Abc_Obj_t *)((ulong)pAVar9 ^ 1));
    if (0 < pAVar5->vPos->nSize) {
      Abc_ObjAssignName((Abc_Obj_t *)*pAVar5->vPos->pArray,"rel",(char *)0x0);
      uVar15 = local_428;
      if (local_424 != 0) {
        iVar17 = pAVar5->vPis->nSize;
        if (iVar17 != local_420->vPis->nSize + local_428) {
          __assert_fail("Abc_NtkPiNum(pNtkNew) == Abc_NtkPiNum(pNtk) + 2*nLatches",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                        ,0xd5,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
        }
        if ((int)local_428 < iVar17) {
          do {
            pAVar5 = local_430;
            iVar17 = iVar17 + -1;
            Abc_NtkQuantify(local_430,0,iVar17,(int)vPairs);
            Abc_NtkCleanData(pAVar5);
            Abc_AigCleanup((Abc_Aig_t *)pAVar5->pManFunc);
            Abc_NtkSynthesize(&local_430,1);
            pAVar5 = local_430;
          } while ((int)uVar15 < iVar17);
        }
        Abc_NtkCleanData(pAVar5);
        Abc_AigCleanup((Abc_Aig_t *)pAVar5->pManFunc);
        uVar11 = pAVar5->vPis->nSize;
        uVar18 = uVar11;
        for (; (int)uVar15 < (int)uVar11; uVar11 = uVar11 - 1) {
          uVar18 = uVar18 - 1;
          if (((int)uVar11 < 1) || (pAVar5->vPis->nSize < (int)uVar11)) goto LAB_002f6b17;
          pAVar9 = (Abc_Obj_t *)pAVar5->vPis->pArray[uVar18];
          if ((pAVar9->vFanouts).nSize != 0) {
            __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                          ,0xea,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
          }
          Abc_NtkDeleteObj(pAVar9);
        }
      }
      iVar17 = Abc_NtkCheck(pAVar5);
      if (iVar17 == 0) {
        puts("Abc_NtkTransRel: The network check has failed.");
        Abc_NtkDelete(pAVar5);
        pAVar5 = (Abc_Ntk_t *)0x0;
      }
      return pAVar5;
    }
  }
LAB_002f6b17:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkTransRel( Abc_Ntk_t * pNtk, int fInputs, int fVerbose )
{
    char Buffer[1000];
    Vec_Ptr_t * vPairs;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pMiter;
    int i, nLatches;
    int fSynthesis = 1;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) );
    nLatches = Abc_NtkLatchNum(pNtk);
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    // duplicate the name and the spec
    sprintf( Buffer, "%s_TR", pNtk->pName );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Abc_NtkCleanCopy( pNtk );
    // create current state variables
    Abc_NtkForEachLatchOutput( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // create next state variables
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtkNew), Abc_ObjName(pObj), NULL );
    // create PI variables
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // create the PO
    Abc_NtkCreatePo( pNtkNew );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // create the function of the primary output
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
    vPairs = Vec_PtrAlloc( 2*nLatches );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPairs, Abc_NtkPi(pNtkNew, i+nLatches) );
    }
    pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkNew->pManFunc, vPairs, 0 );
    Vec_PtrFree( vPairs );
    // add the primary output
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), Abc_ObjNot(pMiter) );
    Abc_ObjAssignName( Abc_NtkPo(pNtkNew,0), "rel", NULL );

    // quantify inputs
    if ( fInputs )
    {
        assert( Abc_NtkPiNum(pNtkNew) == Abc_NtkPiNum(pNtk) + 2*nLatches );
        for ( i = Abc_NtkPiNum(pNtkNew) - 1; i >= 2*nLatches; i-- )
//        for ( i = 2*nLatches; i < Abc_NtkPiNum(pNtkNew); i++ )
        {
            Abc_NtkQuantify( pNtkNew, 0, i, fVerbose );
//            if ( fSynthesis && (i % 3 == 2) )
            if ( fSynthesis  )
            {
                Abc_NtkCleanData( pNtkNew );
                Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
                Abc_NtkSynthesize( &pNtkNew, 1 );
            }
//            printf( "Var = %3d. Nodes = %6d. ", Abc_NtkPiNum(pNtkNew) - 1 - i, Abc_NtkNodeNum(pNtkNew) );
//            printf( "Var = %3d. Nodes = %6d. ", i - 2*nLatches, Abc_NtkNodeNum(pNtkNew) );
        }
//        printf( "\n" );
        Abc_NtkCleanData( pNtkNew );
        Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
        for ( i = Abc_NtkPiNum(pNtkNew) - 1; i >= 2*nLatches; i-- )
        {
            pObj = Abc_NtkPi( pNtkNew, i );
            assert( Abc_ObjFanoutNum(pObj) == 0 );
            Abc_NtkDeleteObj( pObj );
        }
    }

    // check consistency of the network
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkTransRel: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}